

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

CompiledType * __thiscall
capnp::compiler::Compiler::ModuleScope::getRoot
          (CompiledType *__return_storage_ptr__,ModuleScope *this)

{
  uint *puVar1;
  Node *startingScope;
  uint64_t startingScopeId;
  bool bVar2;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *pEVar3;
  Mutex *pMVar4;
  undefined1 uVar5;
  BrandScope *pBVar6;
  undefined1 uVar7;
  Refcounted *refcounted;
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_238;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_188;
  BrandedDecl local_d8;
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *this_00;
  
  local_238.mutex = (Mutex *)0x0;
  local_238.value.body.tag = 0;
  local_238.value.brand.disposer = (Disposer *)0x0;
  local_238.value.brand.ptr = (BrandScope *)0x0;
  local_238.value.source._reader.segment = (SegmentReader *)0x0;
  local_238.value.source._reader.capTable = (CapTableReader *)0x0;
  local_238.value.source._reader.data = (void *)0x0;
  local_238.value.source._reader.pointers._0_6_ = 0;
  local_238.value.source._reader.pointers._6_2_ = 0;
  local_238.value.source._reader.dataSize = 0;
  local_238.value.source._reader.pointerCount = 0;
  local_238.value.source._reader.nestingLimit = 0x7fffffff;
  this_00 = &this->compiler->impl;
  local_d8.body.tag = local_d8.body.tag & 0xffffff00;
  kj::_::Mutex::lock(&this_00->mutex,0);
  startingScope = this->node;
  startingScopeId = startingScope->id;
  pBVar6 = (BrandScope *)operator_new(0x50);
  BrandScope::BrandScope
            (pBVar6,(ErrorReporter *)&ErrorIgnorer::instance,startingScopeId,0,
             &startingScope->super_Resolver);
  puVar1 = &(pBVar6->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_d8.body.field_1._32_8_ = this->node;
  local_d8.body.field_1._0_8_ = ((Node *)local_d8.body.field_1._32_8_)->id;
  local_d8.body.field_1._24_2_ = ((Node *)local_d8.body.field_1._32_8_)->kind;
  local_d8.source._reader.dataSize = 0;
  local_d8.source._reader.pointerCount = 0;
  local_d8.source._reader._38_2_ = 0;
  local_d8.source._reader.data = (void *)0x0;
  local_d8.source._reader.pointers = (WirePointer *)0x0;
  local_d8.source._reader.segment = (SegmentReader *)0x0;
  local_d8.source._reader.capTable = (CapTableReader *)0x0;
  local_d8.source._reader.nestingLimit = 0x7fffffff;
  local_d8.source._reader._44_4_ = 0;
  local_d8.body.field_1._8_4_ = 0;
  local_d8.body.field_1._16_8_ = 0;
  local_d8.body.field_1.space[0x28] = '\0';
  local_d8.body.tag = 1;
  local_238.mutex = &this_00->mutex;
  local_d8.brand.disposer = (Disposer *)pBVar6;
  local_d8.brand.ptr = pBVar6;
  BrandedDecl::operator=(&local_238.value,&local_d8);
  if (local_d8.brand.ptr != (BrandScope *)0x0) {
    local_d8.brand.ptr = (BrandScope *)0x0;
    (**(((Refcounted *)&(local_d8.brand.disposer)->_vptr_Disposer)->super_Disposer)._vptr_Disposer)
              ();
  }
  kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  pBVar6 = local_238.value.brand.ptr;
  uVar5 = local_238.value.body.field_1.space[0x28];
  pMVar4 = local_238.mutex;
  uVar7 = SUB81(this_00,0);
  local_188.value.body.tag = local_238.value.body.tag;
  if (local_238.value.body.tag == 1) {
    local_188.value.body.field_1._32_8_ = local_238.value.body.field_1._32_8_;
    local_188.value.body.field_1._16_8_ = local_238.value.body.field_1._16_8_;
    local_188.value.body.field_1._24_8_ = local_238.value.body.field_1._24_8_;
    local_188.value.body.field_1._0_8_ = local_238.value.body.field_1._0_8_;
    local_188.value.body.field_1._8_8_ = local_238.value.body.field_1._8_8_;
    local_188.value.body.field_1.space[0x28] = local_238.value.body.field_1.space[0x28];
    if (local_238.value.body.field_1.space[0x28] == 1) {
      local_188.value.body.field_1._80_8_ = local_238.value.body.field_1._80_8_;
      local_188.value.body.field_1._88_8_ = local_238.value.body.field_1._88_8_;
      local_188.value.body.field_1._64_8_ = local_238.value.body.field_1._64_8_;
      local_188.value.body.field_1._72_8_ = local_238.value.body.field_1._72_8_;
      local_188.value.body.field_1._48_8_ = local_238.value.body.field_1._48_8_;
      local_188.value.body.field_1._56_8_ = local_238.value.body.field_1._56_8_;
      local_238.value.body.field_1.space[0x28] = 0;
    }
    bVar2 = false;
    uVar7 = uVar5;
  }
  else if (local_238.value.body.tag == 2) {
    local_188.value.body.field_1._0_8_ = local_238.value.body.field_1._0_8_;
    local_188.value.body.field_1._8_8_ = local_238.value.body.field_1._8_8_;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  local_188.value.brand.disposer = local_238.value.brand.disposer;
  local_238.value.brand.ptr = (BrandScope *)0x0;
  local_188.value.source._reader.segment = local_238.value.source._reader.segment;
  local_188.value.source._reader.capTable = local_238.value.source._reader.capTable;
  local_188.value.source._reader.pointers =
       (WirePointer *)
       CONCAT26(local_238.value.source._reader.pointers._6_2_,
                local_238.value.source._reader.pointers._0_6_);
  local_188.value.source._reader.data = local_238.value.source._reader.data;
  local_188.value.source._reader._38_2_ = local_238.value.source._reader._38_2_;
  local_188.value.source._reader.dataSize = local_238.value.source._reader.dataSize;
  local_188.value.source._reader.pointerCount = local_238.value.source._reader.pointerCount;
  local_188.value.source._reader._44_4_ = local_238.value.source._reader._44_4_;
  local_188.value.source._reader.nestingLimit = local_238.value.source._reader.nestingLimit;
  local_238.mutex = (Mutex *)0x0;
  __return_storage_ptr__->compiler = this->compiler;
  (__return_storage_ptr__->decl).mutex = pMVar4;
  (__return_storage_ptr__->decl).value.body.tag = local_238.value.body.tag;
  if (local_238.value.body.tag == 1) {
    *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 0x20) =
         local_188.value.body.field_1._32_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 0x10) =
         local_188.value.body.field_1._16_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 0x18) =
         local_188.value.body.field_1._24_8_;
    *(undefined8 *)&(__return_storage_ptr__->decl).value.body.field_1 =
         local_188.value.body.field_1._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 8) =
         local_188.value.body.field_1._8_8_;
    (__return_storage_ptr__->decl).value.body.field_1.space[0x28] = uVar7;
    if ((uVar7 & 1) != 0) {
      *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 0x50) =
           local_188.value.body.field_1._80_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 0x58) =
           local_188.value.body.field_1._88_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 0x40) =
           local_188.value.body.field_1._64_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 0x48) =
           local_188.value.body.field_1._72_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 0x30) =
           local_188.value.body.field_1._48_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 0x38) =
           local_188.value.body.field_1._56_8_;
      local_188.value.body.field_1.space[0x28] = 0;
    }
  }
  if (bVar2) {
    *(undefined8 *)&(__return_storage_ptr__->decl).value.body.field_1 =
         local_188.value.body.field_1._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->decl).value.body.field_1 + 8) =
         local_188.value.body.field_1._8_8_;
  }
  (__return_storage_ptr__->decl).value.brand.disposer = local_238.value.brand.disposer;
  (__return_storage_ptr__->decl).value.brand.ptr = pBVar6;
  local_188.value.brand.ptr = (BrandScope *)0x0;
  pEVar3 = &__return_storage_ptr__->decl;
  (pEVar3->value).source._reader.dataSize = local_238.value.source._reader.dataSize;
  (pEVar3->value).source._reader.pointerCount = local_238.value.source._reader.pointerCount;
  *(undefined2 *)&(pEVar3->value).source._reader.field_0x26 = local_238.value.source._reader._38_2_;
  *(ulong *)&(__return_storage_ptr__->decl).value.source._reader.nestingLimit =
       CONCAT44(local_238.value.source._reader._44_4_,local_238.value.source._reader.nestingLimit);
  (__return_storage_ptr__->decl).value.source._reader.data = local_238.value.source._reader.data;
  (__return_storage_ptr__->decl).value.source._reader.pointers =
       (WirePointer *)
       CONCAT26(local_238.value.source._reader.pointers._6_2_,
                local_238.value.source._reader.pointers._0_6_);
  (__return_storage_ptr__->decl).value.source._reader.segment =
       local_238.value.source._reader.segment;
  (__return_storage_ptr__->decl).value.source._reader.capTable =
       local_238.value.source._reader.capTable;
  local_188.mutex = (Mutex *)0x0;
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_188);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_238);
  return __return_storage_ptr__;
}

Assistant:

Compiler::CompiledType Compiler::ModuleScope::getRoot() {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;

  {
    auto lock = compiler.impl.lockExclusive();
    auto brandScope = kj::refcounted<BrandScope>(ErrorIgnorer::instance, node.getId(), 0, node);
    Resolver::ResolvedDecl decl { node.getId(), 0, 0, node.getKind(), &node, kj::none };
    newDecl.set(lock, BrandedDecl(kj::mv(decl), kj::mv(brandScope), {}));
  }

  return CompiledType(compiler, kj::mv(newDecl));
}